

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void detectEWMH(void)

{
  unsigned_long uVar1;
  unsigned_long atomCount;
  Atom *supportedAtoms;
  Atom wmSupported;
  Atom supportingWmCheck;
  Window *windowFromChild;
  Window *windowFromRoot;
  
  windowFromChild = (Window *)0x0;
  supportingWmCheck = 0;
  wmSupported = XInternAtom(_glfw.x11.display,"_NET_SUPPORTING_WM_CHECK",1);
  supportedAtoms = (Atom *)XInternAtom(_glfw.x11.display,"_NET_SUPPORTED",1);
  if ((wmSupported != 0) && (supportedAtoms != (Atom *)0x0)) {
    uVar1 = _glfwGetWindowProperty(_glfw.x11.root,wmSupported,0x21,(uchar **)&windowFromChild);
    if (uVar1 == 1) {
      _glfwGrabXErrorHandler();
      uVar1 = _glfwGetWindowProperty(*windowFromChild,wmSupported,0x21,(uchar **)&supportingWmCheck)
      ;
      if (uVar1 == 1) {
        _glfwReleaseXErrorHandler();
        if (*windowFromChild == *(Window *)supportingWmCheck) {
          XFree(windowFromChild);
          XFree(supportingWmCheck);
          uVar1 = _glfwGetWindowProperty(_glfw.x11.root,(Atom)supportedAtoms,4,(uchar **)&atomCount)
          ;
          _glfw.x11.NET_WM_STATE = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE");
          _glfw.x11.NET_WM_STATE_ABOVE =
               getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_ABOVE");
          _glfw.x11.NET_WM_STATE_FULLSCREEN =
               getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_FULLSCREEN");
          _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
               getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_FULLSCREEN_MONITORS");
          _glfw.x11.NET_WM_NAME = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_NAME");
          _glfw.x11.NET_WM_ICON_NAME = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_ICON_NAME")
          ;
          _glfw.x11.NET_WM_PID = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_PID");
          _glfw.x11.NET_WM_PING = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_PING");
          _glfw.x11.NET_ACTIVE_WINDOW =
               getSupportedAtom((Atom *)atomCount,uVar1,"_NET_ACTIVE_WINDOW");
          _glfw.x11.NET_FRAME_EXTENTS =
               getSupportedAtom((Atom *)atomCount,uVar1,"_NET_FRAME_EXTENTS");
          _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
               getSupportedAtom((Atom *)atomCount,uVar1,"_NET_REQUEST_FRAME_EXTENTS");
          _glfw.x11.NET_WM_BYPASS_COMPOSITOR =
               getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_BYPASS_COMPOSITOR");
          XFree(atomCount);
        }
        else {
          XFree(windowFromChild);
          XFree(supportingWmCheck);
        }
      }
      else {
        XFree(windowFromChild);
        if (supportingWmCheck != 0) {
          XFree(supportingWmCheck);
        }
      }
    }
    else if (windowFromChild != (Window *)0x0) {
      XFree(windowFromChild);
    }
  }
  return;
}

Assistant:

static void detectEWMH(void)
{
    Window* windowFromRoot = NULL;
    Window* windowFromChild = NULL;

    // First we need a couple of atoms, which should already be there
    Atom supportingWmCheck =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTING_WM_CHECK", True);
    Atom wmSupported =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTED", True);
    if (supportingWmCheck == None || wmSupported == None)
        return;

    // Then we look for the _NET_SUPPORTING_WM_CHECK property of the root window
    if (_glfwGetWindowProperty(_glfw.x11.root,
                               supportingWmCheck,
                               XA_WINDOW,
                               (unsigned char**) &windowFromRoot) != 1)
    {
        if (windowFromRoot)
            XFree(windowFromRoot);
        return;
    }

    _glfwGrabXErrorHandler();

    // It should be the ID of a child window (of the root)
    // Then we look for the same property on the child window
    if (_glfwGetWindowProperty(*windowFromRoot,
                               supportingWmCheck,
                               XA_WINDOW,
                               (unsigned char**) &windowFromChild) != 1)
    {
        XFree(windowFromRoot);
        if (windowFromChild)
            XFree(windowFromChild);
        return;
    }

    _glfwReleaseXErrorHandler();

    // It should be the ID of that same child window
    if (*windowFromRoot != *windowFromChild)
    {
        XFree(windowFromRoot);
        XFree(windowFromChild);
        return;
    }

    XFree(windowFromRoot);
    XFree(windowFromChild);

    // We are now fairly sure that an EWMH-compliant window manager is running

    Atom* supportedAtoms;
    unsigned long atomCount;

    // Now we need to check the _NET_SUPPORTED property of the root window
    // It should be a list of supported WM protocol and state atoms
    atomCount = _glfwGetWindowProperty(_glfw.x11.root,
                                       wmSupported,
                                       XA_ATOM,
                                       (unsigned char**) &supportedAtoms);

    // See which of the atoms we support that are supported by the WM
    _glfw.x11.NET_WM_STATE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE");
    _glfw.x11.NET_WM_STATE_ABOVE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_ABOVE");
    _glfw.x11.NET_WM_STATE_FULLSCREEN =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_FULLSCREEN");
    _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_FULLSCREEN_MONITORS");
    _glfw.x11.NET_WM_NAME =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_NAME");
    _glfw.x11.NET_WM_ICON_NAME =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_ICON_NAME");
    _glfw.x11.NET_WM_PID =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_PID");
    _glfw.x11.NET_WM_PING =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_PING");
    _glfw.x11.NET_ACTIVE_WINDOW =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_ACTIVE_WINDOW");
    _glfw.x11.NET_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_FRAME_EXTENTS");
    _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_REQUEST_FRAME_EXTENTS");
    _glfw.x11.NET_WM_BYPASS_COMPOSITOR =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_BYPASS_COMPOSITOR");

    XFree(supportedAtoms);
}